

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O2

Dimension_ConstantDimension * __thiscall
CoreML::Specification::MILSpec::Dimension::mutable_constant(Dimension *this)

{
  Dimension_ConstantDimension *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->dimension_).constant_;
  }
  else {
    clear_dimension(this);
    this->_oneof_case_[0] = 1;
    this_00 = (Dimension_ConstantDimension *)operator_new(0x20);
    Dimension_ConstantDimension::Dimension_ConstantDimension(this_00);
    (this->dimension_).constant_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::MILSpec::Dimension_ConstantDimension* Dimension::mutable_constant() {
  if (!has_constant()) {
    clear_dimension();
    set_has_constant();
    dimension_.constant_ = new ::CoreML::Specification::MILSpec::Dimension_ConstantDimension;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.MILSpec.Dimension.constant)
  return dimension_.constant_;
}